

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::Attribute::Attribute(Attribute *this,Attribute *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->_varying_authored = param_1->_varying_authored;
  this->_variability = param_1->_variability;
  std::__cxx11::string::string((string *)&this->_type_name,(string *)&param_1->_type_name);
  primvar::PrimVar::PrimVar(&this->_var,&param_1->_var);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  return;
}

Assistant:

Attribute() = default;